

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O3

bool __thiscall
Centaurus::CompositeATN<char>::verify_decisions
          (CompositeATN<char> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
          *network)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  long lVar3;
  _Hash_node_base *p_Var4;
  long lVar5;
  ATNPath local_90;
  ATNPath local_70;
  LookaheadDFA<char> local_50;
  
  p_Var4 = (network->_M_h)._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var4[8]._M_nxt;
      p_Var1 = p_Var4[7]._M_nxt;
      if (0 < (int)((ulong)((long)p_Var2 - (long)p_Var1) >> 3) * 0x286bca1b) {
        lVar3 = 0x10;
        lVar5 = 0;
        do {
          if (1 < (int)((ulong)(*(long *)((long)&p_Var1->_M_nxt + lVar3) -
                               *(long *)((long)&p_Var1[-1]._M_nxt + lVar3)) >> 3) * -0x55555555) {
            ATNPath::ATNPath(&local_70,(Identifier *)(p_Var4 + 1),(int)lVar5);
            convert_atn_path(&local_90,this,&local_70);
            LookaheadDFA<char>::LookaheadDFA(&local_50,this,&local_90,true);
            local_50.super_NFABase<Centaurus::LDFAState<char>_>._vptr_NFABase =
                 (_func_int **)&PTR__NFABase_001a6b18;
            std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
            ~vector(&local_50.super_NFABase<Centaurus::LDFAState<char>_>.m_states);
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector(&local_90.
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     );
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector(&local_70.
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     );
            p_Var1 = p_Var4[7]._M_nxt;
            p_Var2 = p_Var4[8]._M_nxt;
          }
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + 0x98;
        } while (lVar5 < (int)((ulong)((long)p_Var2 - (long)p_Var1) >> 3) * 0x286bca1b);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return true;
}

Assistant:

bool CompositeATN<TCHAR>::verify_decisions(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
    for (const auto& p : network)
    {
        for (int i = 0; i < p.second.get_node_num(); i++)
        {
            int outbound_num = p.second.get_node(i).get_transitions().size();

            if (outbound_num > 1)
            {
                try
                {
                    LookaheadDFA<TCHAR>(*this, convert_atn_path(ATNPath(p.first, i)));
                }
                catch (...)
                {
                    std::wcerr << L"Decision check failed at " << ATNPath(p.first, i) << std::endl;
                    return false;
                }
            }
        }
    }
    return true;
}